

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transwarp.h
# Opt level: O1

void transwarp::detail::
     call_with_each_index<4ul,5ul,6ul,7ul,transwarp::detail::parent_visitor,std::tuple<std::__cxx11::string,int,int>,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::__cxx11::string,std::__cxx11::string>
               (parent_visitor *param_1,long param_2)

{
  itask *task;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  invalid_parameter *this_00;
  string local_48;
  
  task = *(itask **)(param_2 + 0x30);
  this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(param_2 + 0x38);
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this->_M_use_count = this->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this->_M_use_count = this->_M_use_count + 1;
    }
  }
  if (task != (itask *)0x0) {
    parent_visitor::operator()(param_1,task);
    call_with_each_index<5ul,6ul,7ul,transwarp::detail::parent_visitor,std::tuple<std::__cxx11::string,int,int>,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::__cxx11::string,std::__cxx11::string>
              (param_1,param_2);
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      return;
    }
    return;
  }
  this_00 = (invalid_parameter *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"task pointer","");
  invalid_parameter::invalid_parameter(this_00,&local_48);
  __cxa_throw(this_00,&invalid_parameter::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void call_with_each_index(transwarp::detail::indices<i, j...>, const Functor& f, const std::tuple<std::shared_ptr<transwarp::task<ParentResults>>...>& t) {
    auto ptr = std::get<i>(t);
    if (!ptr) {
        throw transwarp::invalid_parameter("task pointer");
    }
    f(*ptr);
    transwarp::detail::call_with_each_index(transwarp::detail::indices<j...>(), f, t);
}